

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkTimePrint(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  float *pfVar2;
  char *pcVar3;
  Abc_Time_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    printf("Default arrival = %8f\n",(double)(pNtk->pManTime->tArrDef).Fall);
    printf("Default required = %8f\n",(double)(pNtk->pManTime->tReqDef).Fall);
    printf("Inputs (%d):\n",(ulong)(uint)pNtk->vCis->nSize);
    pVVar5 = pNtk->vCis;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar6];
        pcVar3 = Abc_ObjName(pAVar1);
        pfVar2 = (float *)pAVar1->pNtk->pManTime->vArrs->pArray[pAVar1->Id];
        fVar7 = *pfVar2;
        fVar8 = pfVar2[1];
        if (fVar7 <= fVar8) {
          fVar7 = fVar8;
        }
        pAVar4 = Abc_NodeReadRequired(pAVar1);
        fVar8 = pAVar4->Rise;
        pAVar4 = Abc_NodeReadRequired(pAVar1);
        if (pAVar4->Fall <= fVar8) {
          fVar8 = pAVar4->Fall;
        }
        printf("%20s   arrival = %8f   required = %8f\n",(double)fVar7,(double)fVar8,pcVar3);
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vCis;
      } while (lVar6 < pVVar5->nSize);
    }
    printf("Outputs (%d):\n",(ulong)(uint)pNtk->vCos->nSize);
    pVVar5 = pNtk->vCos;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar6];
        pcVar3 = Abc_ObjName(pAVar1);
        pfVar2 = (float *)pAVar1->pNtk->pManTime->vArrs->pArray[pAVar1->Id];
        fVar7 = *pfVar2;
        fVar8 = pfVar2[1];
        if (fVar7 <= fVar8) {
          fVar7 = fVar8;
        }
        pAVar4 = Abc_NodeReadRequired(pAVar1);
        fVar8 = pAVar4->Rise;
        pAVar4 = Abc_NodeReadRequired(pAVar1);
        if (pAVar4->Fall <= fVar8) {
          fVar8 = pAVar4->Fall;
        }
        printf("%20s   arrival = %8f   required = %8f\n",(double)fVar7,(double)fVar8,pcVar3);
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vCos;
      } while (lVar6 < pVVar5->nSize);
    }
    return;
  }
  puts("There is no timing manager");
  return;
}

Assistant:

void Abc_NtkTimePrint( Abc_Ntk_t * pNtk )
{
    if ( pNtk->pManTime == NULL )
        printf( "There is no timing manager\n" );
    else
    {
        Abc_Obj_t * pObj; int i;
        printf( "Default arrival = %8f\n", pNtk->pManTime->tArrDef.Fall );
        printf( "Default required = %8f\n", pNtk->pManTime->tReqDef.Fall );
        printf( "Inputs (%d):\n", Abc_NtkCiNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            printf( "%20s   arrival = %8f   required = %8f\n", 
                Abc_ObjName(pObj), 
                Abc_NodeReadArrivalWorst(pObj), 
                Abc_NodeReadRequiredWorst(pObj) );
        printf( "Outputs (%d):\n", Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            printf( "%20s   arrival = %8f   required = %8f\n", 
                Abc_ObjName(pObj), 
                Abc_NodeReadArrivalWorst(pObj), 
                Abc_NodeReadRequiredWorst(pObj) );
    }
}